

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool New_Profile(black_PWorker worker,TStates aState,Bool overshoot)

{
  PProfile_conflict pTVar1;
  ushort uVar2;
  PProfile_conflict pTVar3;
  ushort uVar4;
  
  pTVar3 = (PProfile_conflict)worker->top;
  if (worker->fProfile == (PProfile_conflict)0x0) {
    worker->cProfile = pTVar3;
    worker->fProfile = pTVar3;
    pTVar3 = pTVar3 + 1;
    worker->top = &pTVar3->X;
  }
  if (pTVar3 < (PProfile_conflict)worker->maxBuff) {
    pTVar1 = worker->cProfile;
    pTVar1->height = 0;
    pTVar1->start = 0;
    pTVar1->offset = &pTVar3->X;
    pTVar1->link = (PProfile)0x0;
    pTVar1->next = (PProfile)0x0;
    uVar2 = (ushort)worker->dropOutControl;
    pTVar1->flags = uVar2;
    if (aState == Ascending_State) {
      pTVar1->flags = uVar2 | 8;
      uVar4 = 0x28;
    }
    else {
      uVar4 = 0x10;
    }
    if (overshoot != '\0') {
      pTVar1->flags = uVar4 | uVar2;
    }
    if (worker->gProfile == (PProfile_conflict)0x0) {
      worker->gProfile = pTVar1;
    }
    worker->state = aState;
    worker->fresh = '\x01';
    worker->joint = '\0';
    return '\0';
  }
  worker->error = 0x62;
  return '\x01';
}

Assistant:

static Bool
  New_Profile( RAS_ARGS TStates  aState,
                        Bool     overshoot )
  {
    if ( !ras.fProfile )
    {
      ras.cProfile  = (PProfile)ras.top;
      ras.fProfile  = ras.cProfile;
      ras.top      += AlignProfileSize;
    }

    if ( ras.top >= ras.maxBuff )
    {
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    ras.cProfile->start  = 0;
    ras.cProfile->height = 0;
    ras.cProfile->offset = ras.top;
    ras.cProfile->link   = (PProfile)0;
    ras.cProfile->next   = (PProfile)0;
    ras.cProfile->flags  = ras.dropOutControl;

    switch ( aState )
    {
    case Ascending_State:
      ras.cProfile->flags |= Flow_Up;
      if ( overshoot )
        ras.cProfile->flags |= Overshoot_Bottom;

      FT_TRACE6(( "  new ascending profile = %p\n", (void *)ras.cProfile ));
      break;

    case Descending_State:
      if ( overshoot )
        ras.cProfile->flags |= Overshoot_Top;
      FT_TRACE6(( "  new descending profile = %p\n", (void *)ras.cProfile ));
      break;

    default:
      FT_ERROR(( "New_Profile: invalid profile direction\n" ));
      ras.error = FT_THROW( Invalid_Outline );
      return FAILURE;
    }

    if ( !ras.gProfile )
      ras.gProfile = ras.cProfile;

    ras.state = aState;
    ras.fresh = TRUE;
    ras.joint = FALSE;

    return SUCCESS;
  }